

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

LinkInterface * __thiscall cmTarget::GetLinkInterface(cmTarget *this,string *config,cmTarget *head)

{
  cmState *pcVar1;
  bool bVar2;
  LinkInterface *pLVar3;
  cmTargetInternals *this_00;
  mapped_type *iface;
  mapped_type *pmVar4;
  string CONFIG;
  cmTarget *local_48;
  string local_40;
  
  local_48 = head;
  if (this->IsImportedTarget != true) {
    if ((this->TargetTypeValue != EXECUTABLE) || (bVar2 = IsExecutableWithExports(this), bVar2)) {
      cmsys::SystemTools::UpperCase(&local_40,config);
      this_00 = (cmTargetInternals *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap>_>_>
                ::operator[](&((this->Internal).Pointer)->LinkInterfaceMap,&local_40);
      if (((this_00->Backtrace).Snapshot.Position.Position == 0) ||
         (pcVar1 = (this_00->Backtrace).Snapshot.State,
         *(undefined1 *)
          ((long)&(pcVar1->GlobalProperties).
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header + 0x14) != '\0')) {
        iface = std::
                map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
                ::operator[]((map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
                              *)this_00,&local_48);
        if ((iface->super_LinkInterface).field_0x69 == '\0') {
          (iface->super_LinkInterface).field_0x69 = 1;
          this_00 = (this->Internal).Pointer;
          cmTargetInternals::ComputeLinkInterfaceLibraries(this_00,this,config,iface,local_48,false)
          ;
        }
        if (((iface->super_LinkInterface).field_0x6a == '\0') &&
           ((iface->super_LinkInterface).field_0x6a = 1,
           (iface->super_LinkInterface).field_0x6b == '\x01')) {
          cmTargetInternals::ComputeLinkInterface(this_00,this,config,iface,local_48);
        }
        pmVar4 = (mapped_type *)0x0;
        if ((iface->super_LinkInterface).field_0x6b != '\0') {
          pmVar4 = iface;
        }
      }
      else {
        pmVar4 = (mapped_type *)
                 &(pcVar1->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      pmVar4 = (mapped_type *)0x0;
    }
    return &pmVar4->super_LinkInterface;
  }
  pLVar3 = GetImportLinkInterface(this,config,head,false);
  return pLVar3;
}

Assistant:

cmTarget::LinkInterface const* cmTarget::GetLinkInterface(
                                                  const std::string& config,
                                                  cmTarget const* head) const
{
  // Imported targets have their own link interface.
  if(this->IsImported())
    {
    return this->GetImportLinkInterface(config, head, false);
    }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if(this->GetType() == cmTarget::EXECUTABLE &&
     !this->IsExecutableWithExports())
    {
    return 0;
    }

  // Lookup any existing link interface for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmTargetInternals::HeadToLinkInterfaceMap& hm =
    this->Internal->LinkInterfaceMap[CONFIG];

  // If the link interface does not depend on the head target
  // then return the one we computed first.
  if(!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition)
    {
    return &hm.begin()->second;
    }

  cmTargetInternals::OptionalLinkInterface& iface = hm[head];
  if(!iface.LibrariesDone)
    {
    iface.LibrariesDone = true;
    this->Internal->ComputeLinkInterfaceLibraries(
      this, config, iface, head, false);
    }
  if(!iface.AllDone)
    {
    iface.AllDone = true;
    if(iface.Exists)
      {
      this->Internal->ComputeLinkInterface(this, config, iface, head);
      }
    }

  return iface.Exists? &iface : 0;
}